

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# box.hpp
# Opt level: O2

void __thiscall
pico_tree::internal::box_base<pico_tree::internal::box<float,_3UL>_>::max_side
          (box_base<pico_tree::internal::box<float,_3UL>_> *this,size_type *p_max_index,
          scalar_type *p_max_value)

{
  size_type i;
  size_type sVar1;
  float fVar2;
  float fVar3;
  
  *p_max_value = -3.4028235e+38;
  fVar2 = -3.4028235e+38;
  for (sVar1 = 0; sVar1 != 3; sVar1 = sVar1 + 1) {
    fVar3 = *(float *)(this + sVar1 * 4 + 0xc) - *(float *)(this + sVar1 * 4);
    if (fVar2 < fVar3) {
      *p_max_index = sVar1;
      *p_max_value = fVar3;
      fVar2 = fVar3;
    }
  }
  return;
}

Assistant:

constexpr void max_side(
      size_type& p_max_index, scalar_type& p_max_value) const {
    p_max_value = std::numeric_limits<scalar_type>::lowest();

    for (size_type i = 0; i < derived().size(); ++i) {
      scalar_type const delta = max(i) - min(i);
      if (delta > p_max_value) {
        p_max_index = i;
        p_max_value = delta;
      }
    }
  }